

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

char * __thiscall
llvm::detail::IEEEFloat::convertNormalToHexString
          (IEEEFloat *this,char *dst,uint hexDigits,bool upperCase,roundingMode rounding_mode)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  uint result;
  uint partCount;
  uint uVar5;
  lostFraction lost_fraction;
  uint uVar6;
  ulong uVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  Significand *parts;
  long lVar12;
  
  *dst = '0';
  dst[1] = !upperCase * ' ' + 0x58;
  pcVar11 = "0123456789abcdef0";
  if ((int)CONCAT71(in_register_00000009,upperCase) != 0) {
    pcVar11 = "0123456789ABCDEF0";
  }
  uVar6 = this->semantics->precision;
  if (uVar6 - 0x40 < 0xffffff80) {
    parts = (Significand *)(this->significand).parts;
  }
  else {
    parts = &this->significand;
  }
  partCount = uVar6 + 0x40 >> 6;
  bVar3 = (byte)(uVar6 + 3) & 0x3f;
  uVar5 = significandLSB(this);
  uVar5 = (uVar6 - uVar5) + 6 >> 2;
  if (hexDigits == 0) {
    bVar4 = false;
  }
  else if (hexDigits < uVar5) {
    uVar5 = uVar6 + 3 + hexDigits * -4;
    lost_fraction = lostFractionThroughTruncation(&parts->part,partCount,uVar5);
    bVar4 = roundAwayFromZero(this,rounding_mode,lost_fraction,uVar5);
    uVar5 = hexDigits;
  }
  else {
    bVar4 = false;
    uVar5 = hexDigits;
  }
  lVar10 = 3;
  uVar7 = (ulong)(uVar6 + 0x42 >> 6);
  while ((uVar5 != 0 && (uVar7 != 0))) {
    uVar1 = uVar7 - 1;
    if (uVar1 == partCount) {
      uVar9 = 0;
    }
    else {
      uVar9 = parts[uVar1].part << (0x40 - bVar3 & 0x3f);
    }
    if (uVar1 != 0) {
      uVar9 = uVar9 | parts[uVar7 - 2].part >> bVar3;
    }
    uVar7 = 0x10;
    if (uVar5 < 0x10) {
      uVar7 = (ulong)uVar5;
    }
    uVar9 = uVar9 >> ((char)uVar7 * -4 & 0x3fU);
    uVar8 = uVar7;
    while (uVar8 != 0) {
      dst[uVar8 + lVar10 + -1] = pcVar11[(uint)uVar9 & 0xf];
      uVar9 = uVar9 >> 4;
      uVar8 = uVar8 - 1;
    }
    lVar10 = lVar10 + uVar7;
    uVar5 = uVar5 - (int)uVar7;
    uVar7 = uVar1;
  }
  if (bVar4 == false) {
    memset(dst + lVar10,0x30,(ulong)uVar5);
    lVar10 = lVar10 + (ulong)uVar5;
  }
  else {
    lVar12 = lVar10 + 1;
    do {
      uVar6 = hexDigitValue(dst[lVar12 + -2]);
      cVar2 = pcVar11[uVar6 + 1];
      dst[lVar12 + -2] = cVar2;
      lVar12 = lVar12 + -1;
    } while (cVar2 == '0');
    if (lVar12 < 4) {
      __assert_fail("q >= p",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xac1,
                    "char *llvm::detail::IEEEFloat::convertNormalToHexString(char *, unsigned int, bool, roundingMode) const"
                   );
    }
  }
  dst[2] = dst[3];
  if (lVar10 == 4) {
    lVar10 = 3;
  }
  else {
    dst[3] = '.';
  }
  dst[lVar10] = !upperCase * ' ' | 0x50;
  uVar6 = (uint)this->exponent;
  if (this->exponent < 0) {
    dst[lVar10 + 1] = '-';
    lVar10 = lVar10 + 2;
    uVar6 = -uVar6;
  }
  else {
    lVar10 = lVar10 + 1;
  }
  pcVar11 = writeUnsignedDecimal(dst + lVar10,uVar6);
  return pcVar11;
}

Assistant:

char *IEEEFloat::convertNormalToHexString(char *dst, unsigned int hexDigits,
                                          bool upperCase,
                                          roundingMode rounding_mode) const {
  unsigned int count, valueBits, shift, partsCount, outputDigits;
  const char *hexDigitChars;
  const integerPart *significand;
  char *p;
  bool roundUp;

  *dst++ = '0';
  *dst++ = upperCase ? 'X': 'x';

  roundUp = false;
  hexDigitChars = upperCase ? hexDigitsUpper: hexDigitsLower;

  significand = significandParts();
  partsCount = partCount();

  /* +3 because the first digit only uses the single integer bit, so
     we have 3 virtual zero most-significant-bits.  */
  valueBits = semantics->precision + 3;
  shift = integerPartWidth - valueBits % integerPartWidth;

  /* The natural number of digits required ignoring trailing
     insignificant zeroes.  */
  outputDigits = (valueBits - significandLSB () + 3) / 4;

  /* hexDigits of zero means use the required number for the
     precision.  Otherwise, see if we are truncating.  If we are,
     find out if we need to round away from zero.  */
  if (hexDigits) {
    if (hexDigits < outputDigits) {
      /* We are dropping non-zero bits, so need to check how to round.
         "bits" is the number of dropped bits.  */
      unsigned int bits;
      lostFraction fraction;

      bits = valueBits - hexDigits * 4;
      fraction = lostFractionThroughTruncation (significand, partsCount, bits);
      roundUp = roundAwayFromZero(rounding_mode, fraction, bits);
    }
    outputDigits = hexDigits;
  }

  /* Write the digits consecutively, and start writing in the location
     of the hexadecimal point.  We move the most significant digit
     left and add the hexadecimal point later.  */
  p = ++dst;

  count = (valueBits + integerPartWidth - 1) / integerPartWidth;

  while (outputDigits && count) {
    integerPart part;

    /* Put the most significant integerPartWidth bits in "part".  */
    if (--count == partsCount)
      part = 0;  /* An imaginary higher zero part.  */
    else
      part = significand[count] << shift;

    if (count && shift)
      part |= significand[count - 1] >> (integerPartWidth - shift);

    /* Convert as much of "part" to hexdigits as we can.  */
    unsigned int curDigits = integerPartWidth / 4;

    if (curDigits > outputDigits)
      curDigits = outputDigits;
    dst += partAsHex (dst, part, curDigits, hexDigitChars);
    outputDigits -= curDigits;
  }

  if (roundUp) {
    char *q = dst;

    /* Note that hexDigitChars has a trailing '0'.  */
    do {
      q--;
      *q = hexDigitChars[hexDigitValue (*q) + 1];
    } while (*q == '0');
    assert(q >= p);
  } else {
    /* Add trailing zeroes.  */
    memset (dst, '0', outputDigits);
    dst += outputDigits;
  }

  /* Move the most significant digit to before the point, and if there
     is something after the decimal point add it.  This must come
     after rounding above.  */
  p[-1] = p[0];
  if (dst -1 == p)
    dst--;
  else
    p[0] = '.';

  /* Finally output the exponent.  */
  *dst++ = upperCase ? 'P': 'p';

  return writeSignedDecimal (dst, exponent);
}